

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  _Rb_tree_header *p_Var1;
  pointer file;
  Symbol SVar2;
  DescriptorBuilder *pDVar3;
  bool bVar4;
  FileDescriptor *pFVar5;
  _Base_ptr p_Var6;
  undefined7 extraout_var;
  _Base_ptr p_Var7;
  anon_union_8_8_13f84498_for_Symbol_2 extraout_RDX;
  DescriptorBuilder *this_00;
  DescriptorBuilder *pDVar8;
  Symbol SVar9;
  undefined1 auVar10 [16];
  Symbol result;
  Type local_40;
  anon_union_8_8_13f84498_for_Symbol_2 local_38;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  
  SVar9 = FindSymbolNotEnforcingDeps(this,name,build_it);
  local_38 = SVar9.field_1;
  local_40 = SVar9.type;
  if (local_40 == NULL_SYMBOL) {
    auVar13._0_4_ = SVar9.type;
    auVar17._4_4_ = SVar9._4_4_;
    register0x00000010 = SVar9.field_1;
    return (Symbol)auVar13;
  }
  if (this->pool_->enforce_dependencies_ != true) {
    auVar12._0_4_ = SVar9.type;
    auVar16._4_4_ = SVar9._4_4_;
    register0x00000010 = SVar9.field_1;
    return (Symbol)auVar12;
  }
  this_00 = (DescriptorBuilder *)&stack0xffffffffffffffc0;
  pFVar5 = Symbol::GetFile((Symbol *)this_00);
  if (pFVar5 != this->file_) {
    p_Var1 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var7 != (_Base_ptr)0x0;
        p_Var7 = (&p_Var7->_M_left)[*(FileDescriptor **)(p_Var7 + 1) < pFVar5]) {
      if (*(FileDescriptor **)(p_Var7 + 1) >= pFVar5) {
        p_Var6 = p_Var7;
      }
    }
    p_Var7 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var7 = p_Var6, pFVar5 < *(FileDescriptor **)(p_Var6 + 1))) {
      p_Var7 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      if (local_40 == PACKAGE) {
        bVar4 = IsInPackage(this_00,this->file_,name);
        SVar9._1_7_ = extraout_var;
        SVar9.type._0_1_ = bVar4;
        SVar9.field_1.descriptor = extraout_RDX.descriptor;
        if (bVar4) goto LAB_002d2b6b;
        pDVar3 = (DescriptorBuilder *)
                 (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (pDVar8 = pDVar3, pDVar8 != (DescriptorBuilder *)p_Var1) {
          file = (pDVar8->options_to_interpret_).
                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          if ((file != (pointer)0x0) &&
             (bVar4 = IsInPackage(this_00,(FileDescriptor *)file,name), bVar4)) {
            SVar9._4_4_ = 0;
            SVar9.type = local_40;
            SVar9.field_1.descriptor = local_38.descriptor;
            break;
          }
          SVar9 = (Symbol)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar8);
          this_00 = pDVar8;
          pDVar3 = SVar9._0_8_;
        }
        if (pDVar8 != (DescriptorBuilder *)p_Var1) {
          auVar11._0_4_ = SVar9.type;
          auVar15._4_4_ = SVar9._4_4_;
          register0x00000010 = SVar9.field_1;
          return (Symbol)auVar11;
        }
      }
      this->possible_undeclared_dependency_ = pFVar5;
      std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
      auVar10._0_4_ = (Type)(ulong)(anonymous_namespace)::kNullSymbol;
      auVar14._4_4_ = (int)((ulong)(anonymous_namespace)::kNullSymbol >> 0x20);
      register0x00000010 = DAT_007e90c0;
      return (Symbol)auVar10;
    }
  }
LAB_002d2b6b:
  SVar2._4_4_ = 0;
  SVar2.type = local_40;
  SVar2.field_1.descriptor = local_38.descriptor;
  return SVar2;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const std::string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    return result;
  }

  if (result.type == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be nullptr if it was not found or had errors.
      if (*it != nullptr && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}